

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O3

void __thiscall
hedg::Rest_Client::
send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Lay>>
          (Rest_Client *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Lay>
          *f,place_order<hedg::Lay> *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string_view target_;
  place_order<hedg::Lay> pVar3;
  request<http::string_body> req;
  undefined1 *puVar4;
  undefined8 in_stack_fffffffffffffef0;
  long in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 *puVar5;
  undefined8 in_stack_ffffffffffffff10;
  long in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 *puVar6;
  undefined8 in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_b0;
  
  target_.ptr_ = (p->end_point)._M_dataplus._M_p;
  target_.len_ = (p->end_point)._M_string_length;
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::
  header<>(&local_b0.super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>,
           post,target_,0xb);
  paVar1 = &local_b0.
            super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
            .value_.field_2;
  local_b0.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_string_length = 0;
  local_b0.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._M_local_buf[0] = '\0';
  puVar4 = &stack0xfffffffffffffef8;
  pcVar2 = (p->end_point)._M_dataplus._M_p;
  local_b0.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,pcVar2,pcVar2 + (p->end_point)._M_string_length);
  pcVar2 = (p->session_id)._M_dataplus._M_p;
  puVar5 = &stack0xffffffffffffff18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff08,pcVar2,pcVar2 + (p->session_id)._M_string_length);
  pcVar2 = (p->market_id)._M_dataplus._M_p;
  puVar6 = &stack0xffffffffffffff38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff28,pcVar2,pcVar2 + (p->market_id)._M_string_length);
  pVar3.end_point._M_string_length = in_stack_fffffffffffffef0;
  pVar3.end_point._M_dataplus._M_p = puVar4;
  pVar3.end_point.field_2._M_allocated_capacity = in_stack_fffffffffffffef8;
  pVar3.end_point.field_2._8_8_ = in_stack_ffffffffffffff00;
  pVar3.session_id._M_dataplus._M_p = puVar5;
  pVar3.session_id._M_string_length = in_stack_ffffffffffffff10;
  pVar3.session_id.field_2._M_allocated_capacity = in_stack_ffffffffffffff18;
  pVar3.session_id.field_2._8_8_ = in_stack_ffffffffffffff20;
  pVar3.market_id._M_dataplus._M_p = puVar6;
  pVar3.market_id._M_string_length = in_stack_ffffffffffffff30;
  pVar3.market_id.field_2._M_allocated_capacity = in_stack_ffffffffffffff38;
  pVar3.market_id.field_2._8_8_ = in_stack_ffffffffffffff40;
  pVar3.orders = p->orders;
  (*f)(&local_b0,pVar3);
  if (puVar6 != &stack0xffffffffffffff38) {
    operator_delete(puVar6,in_stack_ffffffffffffff38 + 1);
  }
  if (puVar5 != &stack0xffffffffffffff18) {
    operator_delete(puVar5,in_stack_ffffffffffffff18 + 1);
  }
  if (puVar4 != &stack0xfffffffffffffef8) {
    operator_delete(puVar4,in_stack_fffffffffffffef8 + 1);
  }
  boost::beast::http::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&(this->super_Client<hedg::Rest_Client>).sock_,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.
         super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
         .value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.
                    super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                    .value_._M_dataplus._M_p,
                    CONCAT71(local_b0.
                             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                             .value_.field_2._M_allocated_capacity._1_7_,
                             local_b0.
                             super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                             .value_.field_2._M_local_buf[0]) + 1);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_b0);
  return;
}

Assistant:

void send(void(*f)(Buff&, T), T p) {
		http::request<http::string_body> req{ http::verb::post, p.end_point, 11 };
		f(req, p);
		http::write(sock_, req);
	}